

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O0

void Sbm_AddCardinConstrRange(sat_solver *p,int *pVars,int lo,int hi,int *pnVars)

{
  int hi_00;
  undefined4 local_2c;
  int mid;
  int i;
  int *pnVars_local;
  int hi_local;
  int lo_local;
  int *pVars_local;
  sat_solver *p_local;
  
  if (0 < hi - lo) {
    hi_00 = lo + (hi - lo) / 2;
    for (local_2c = lo; local_2c <= hi_00; local_2c = local_2c + 1) {
      Sbm_AddSorter(p,pVars,local_2c,local_2c + ((hi - lo) + 1) / 2,pnVars);
    }
    Sbm_AddCardinConstrRange(p,pVars,lo,hi_00,pnVars);
    Sbm_AddCardinConstrRange(p,pVars,hi_00 + 1,hi,pnVars);
    Sbm_AddCardinConstrMerge(p,pVars,lo,hi,1,pnVars);
  }
  return;
}

Assistant:

static inline void Sbm_AddCardinConstrRange( sat_solver * p, int * pVars, int lo, int hi, int * pnVars )
{
    if ( hi - lo >= 1 )
    {
        int i, mid = lo + (hi - lo) / 2;
        for ( i = lo; i <= mid; i++ )
            Sbm_AddSorter( p, pVars, i, i + (hi - lo + 1) / 2, pnVars );
        Sbm_AddCardinConstrRange( p, pVars, lo, mid, pnVars );
        Sbm_AddCardinConstrRange( p, pVars, mid+1, hi, pnVars );
        Sbm_AddCardinConstrMerge( p, pVars, lo, hi, 1, pnVars );
    }
}